

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ReduceRightHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  Var pvVar2;
  Var pvVar3;
  Var pvVar4;
  bool bVar5;
  int iVar6;
  ThreadContext *pTVar7;
  Var pvVar8;
  undefined4 extraout_var;
  JavascriptLibrary *this;
  RecyclableObject *pRVar9;
  undefined4 *puVar10;
  uint *puVar11;
  undefined4 extraout_var_00;
  JavascriptMethod p_Var12;
  Var pvVar13;
  CallInfo local_e0;
  CallInfo local_d8;
  undefined1 local_d0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  uint32 end_1;
  Var undefinedValue;
  BOOL hasItem;
  byte local_a1;
  uint32 end;
  uint uStack_9c;
  bool bPresent;
  uint index;
  uint k;
  Var element;
  Var accumulator;
  RecyclableObject *callBackFn;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  RecyclableObject *pRStack_38;
  uint length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  args_local._4_4_ = length;
  pRStack_38 = obj;
  obj_local = (RecyclableObject *)typedArrayBase;
  typedArrayBase_local = (TypedArrayBase *)pArr;
  pTVar7 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_70,pTVar7);
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,typedArrayBase_local);
  if (1 < (SUB84(args->Info,0) & 0xffffff)) {
    pvVar8 = Arguments::operator[](args,1);
    bVar5 = JavascriptConversion::IsCallable(pvVar8);
    if (bVar5) {
      if (((obj_local == (RecyclableObject *)0x0) && (typedArrayBase_local == (TypedArrayBase *)0x0)
          ) && (bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(pRStack_38), bVar5)) {
        obj_local = (RecyclableObject *)
                    UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(pRStack_38);
      }
      pvVar8 = Arguments::operator[](args,1);
      accumulator = VarTo<Js::RecyclableObject>(pvVar8);
      element = (Var)0x0;
      _index = (Var)0x0;
      uStack_9c = 0;
      end = 0;
      if ((SUB84(args->Info,0) & 0xffffff) < 3) {
        if (args_local._4_4_ == 0) {
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5fe43,(PCWSTR)0x0);
        }
        local_a1 = 0;
        if (obj_local == (RecyclableObject *)0x0) {
          for (; uStack_9c < args_local._4_4_ && (local_a1 & 1) == 0; uStack_9c = uStack_9c + 1) {
            end = ~uStack_9c + args_local._4_4_;
            JsReentLock::unlock((JsReentLock *)local_70);
            undefinedValue._0_4_ = Js::JavascriptOperators::HasItem(pRStack_38,end);
            JsReentLock::MutateArrayObject((JsReentLock *)local_70);
            JsReentLock::relock((JsReentLock *)local_70);
            if ((BOOL)undefinedValue != 0) {
              JsReentLock::unlock((JsReentLock *)local_70);
              element = Js::JavascriptOperators::GetItem
                                  (pRStack_38,end,(ScriptContext *)jsReentLock._24_8_);
              JsReentLock::MutateArrayObject((JsReentLock *)local_70);
              JsReentLock::relock((JsReentLock *)local_70);
              local_a1 = 1;
            }
          }
        }
        else {
          bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
          if (!bVar5) {
            bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x2832,"(VarIsCorrectType(typedArrayBase))",
                                          "VarIsCorrectType(typedArrayBase)");
              if (!bVar5) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            Throw::FatalInternalError(-0x7fffbffb);
          }
          undefinedValue._4_4_ = ArrayObject::GetLength((ArrayObject *)obj_local);
          puVar11 = min<unsigned_int>((uint *)((long)&args_local + 4),
                                      (uint *)((long)&undefinedValue + 4));
          hasItem = *puVar11;
          for (; uStack_9c < (uint)hasItem && (local_a1 & 1) == 0; uStack_9c = uStack_9c + 1) {
            end = ~uStack_9c + args_local._4_4_;
            iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)end);
            _index = (Var)CONCAT44(extraout_var,iVar6);
            local_a1 = 1;
            element = _index;
          }
        }
        if ((local_a1 & 1) == 0) {
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5fe43,(PCWSTR)0x0);
        }
      }
      else {
        element = Arguments::operator[](args,2);
      }
      this = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      pRVar9 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      if (obj_local == (RecyclableObject *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_70);
        pArr_local = (JavascriptArray *)
                     ReduceRightObjectHelper<unsigned_int>
                               (pRStack_38,args_local._4_4_,uStack_9c,
                                (RecyclableObject *)accumulator,element,
                                (ScriptContext *)jsReentLock._24_8_);
      }
      else {
        bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
        if (!bVar5) {
          bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x2856,"(VarIsCorrectType(typedArrayBase))",
                                        "VarIsCorrectType(typedArrayBase)");
            if (!bVar5) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          Throw::FatalInternalError(-0x7fffbffb);
        }
        autoReentrancyHandler._8_4_ = ArrayObject::GetLength((ArrayObject *)obj_local);
        puVar11 = min<unsigned_int>((uint *)((long)&args_local + 4),
                                    (uint *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled);
        autoReentrancyHandler._12_4_ = *puVar11;
        for (; uStack_9c < (uint)autoReentrancyHandler._12_4_; uStack_9c = uStack_9c + 1) {
          end = ~uStack_9c + args_local._4_4_;
          iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)end);
          _index = (Var)CONCAT44(extraout_var_00,iVar6);
          JsReentLock::unlock((JsReentLock *)local_70);
          pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_d0,pTVar7);
          pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar7);
          pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::AssertJsReentrancy(pTVar7);
          pvVar8 = accumulator;
          p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)accumulator);
          CheckIsExecutable((RecyclableObject *)pvVar8,p_Var12);
          p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)accumulator);
          pvVar3 = accumulator;
          CallInfo::CallInfo(&local_d8,CallFlags_Value,5);
          pvVar4 = accumulator;
          CallInfo::CallInfo(&local_e0,CallFlags_Value,5);
          pvVar2 = element;
          pvVar8 = _index;
          pvVar13 = JavascriptNumber::ToVar(end,(ScriptContext *)jsReentLock._24_8_);
          element = (*p_Var12)((RecyclableObject *)pvVar3,(CallInfo)pvVar4,local_d8,0,0,0,0,local_e0
                               ,pRVar9,pvVar2,pvVar8,pvVar13,obj_local);
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_d0);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          JsReentLock::relock((JsReentLock *)local_70);
        }
        pArr_local = (JavascriptArray *)element;
      }
      JsReentLock::~JsReentLock((JsReentLock *)local_70);
      return pArr_local;
    }
  }
  if (obj_local != (RecyclableObject *)0x0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"[TypedArray].prototype.reduceRight"
              );
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"Array.prototype.reduceRight");
}

Assistant:

Var JavascriptArray::ReduceRightHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.reduceRight"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.reduceRight"));
            }
        }

        // If we came from Array.prototype.reduceRight and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var accumulator = nullptr;
        Var element = nullptr;
        T k = 0;
        T index = 0;

        if (args.Info.Count > 2)
        {
            accumulator = args[2];
        }
        else
        {
            if (length == 0)
            {
                JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
            }

            bool bPresent = false;
            if (typedArrayBase)
            {
                AssertAndFailFast(VarIsCorrectType(typedArrayBase));
                uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

                for (; k < end && bPresent == false; k++)
                {
                    // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                    index = length - k - 1;
                    element = typedArrayBase->DirectGetItem((uint32)index);
                    bPresent = true;
                    accumulator = element;
                }
            }
            else
            {
                for (; k < length && bPresent == false; k++)
                {
                    index = length - k - 1;
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, index));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, accumulator = JavascriptOperators::GetItem(obj, index, scriptContext));
                        bPresent = true;
                    }
                }
            }
            if (bPresent == false)
            {
                JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
            }
        }

        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                index = length - k - 1;
                element = typedArrayBase->DirectGetItem((uint32)index);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 5), undefinedValue,
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(index, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceRightObjectHelper<T>(obj, length, k, callBackFn, accumulator, scriptContext));
        }

        return accumulator;
    }